

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.cc
# Opt level: O3

int X509_signature_dump(BIO *bp,ASN1_STRING *sig,int indent)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = sig->length;
  puVar2 = sig->data;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  uVar5 = 0;
  do {
    if (uVar6 == uVar5) {
      iVar3 = BIO_write(bp,"\n",1);
      return (uint)(iVar3 == 1);
    }
    if ((int)((uVar5 & 0xffffffff) / 0x12) * -0x12 + (int)uVar5 == 0) {
      iVar3 = BIO_write(bp,"\n",1);
      if (iVar3 < 1) {
        return 0;
      }
      iVar3 = BIO_indent(bp,indent,indent);
      if (iVar3 < 1) {
        return 0;
      }
    }
    pcVar4 = ":";
    if ((ulong)uVar1 - 1 == uVar5) {
      pcVar4 = "";
    }
    iVar3 = BIO_printf(bp,"%02x%s",(ulong)puVar2[uVar5],pcVar4);
    uVar5 = uVar5 + 1;
    if (iVar3 < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

int X509_signature_dump(BIO *bp, const ASN1_STRING *sig, int indent) {
  const uint8_t *s;
  int i, n;

  n = sig->length;
  s = sig->data;
  for (i = 0; i < n; i++) {
    if ((i % 18) == 0) {
      if (BIO_write(bp, "\n", 1) <= 0 || BIO_indent(bp, indent, indent) <= 0) {
        return 0;
      }
    }
    if (BIO_printf(bp, "%02x%s", s[i], ((i + 1) == n) ? "" : ":") <= 0) {
      return 0;
    }
  }
  if (BIO_write(bp, "\n", 1) != 1) {
    return 0;
  }

  return 1;
}